

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O1

void ures_swapResource(UDataSwapper *ds,Resource *inBundle,Resource *outBundle,Resource res,
                      char *key,TempTable *pTempTable,UErrorCode *pErrorCode)

{
  uint16_t *puVar1;
  Resource *pRVar2;
  Resource *__dest;
  Row *pRVar3;
  UBool UVar4;
  uint16_t uVar5;
  uint uVar6;
  uint uVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint uVar10;
  UDataSwapFn *UNRECOVERED_JUMPTABLE;
  int iVar11;
  ulong uVar12;
  Resource *__src;
  Resource *pRVar13;
  char *pcVar14;
  void *pvVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  Resource *local_68;
  Resource *local_50;
  Resource *local_48;
  
  uVar6 = res >> 0x1c;
  if ((uVar6 < 10) && ((0x2e0U >> uVar6 & 1) != 0)) {
    return;
  }
  uVar17 = res & 0xfffffff;
  if (uVar17 == 0) {
    return;
  }
  uVar7 = pTempTable->resFlags[uVar17 >> 5];
  if ((uVar7 >> (res & 0x1f) & 1) != 0) {
    return;
  }
  pTempTable->resFlags[uVar17 >> 5] = uVar7 | 1 << ((byte)res & 0x1f);
  if (0xe < uVar6) {
switchD_002cd023_caseD_5:
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return;
  }
  puVar1 = (uint16_t *)((long)inBundle + (ulong)(uVar17 * 4));
  pvVar15 = (void *)((ulong)(uVar17 * 4) + (long)outBundle);
  switch(uVar6) {
  case 0:
  case 3:
    iVar8 = udata_readInt32_63(ds,*(int32_t *)puVar1);
    (*ds->swapArray32)(ds,puVar1,4,pvVar15,pErrorCode);
    UNRECOVERED_JUMPTABLE = ds->swapArray16;
    local_68 = (Resource *)(puVar1 + 2);
    iVar11 = iVar8 * 2;
    local_50 = (Resource *)((long)pvVar15 + 4);
    goto LAB_002cd13c;
  case 1:
    iVar8 = udata_readInt32_63(ds,*(int32_t *)puVar1);
    (*ds->swapArray32)(ds,puVar1,4,pvVar15,pErrorCode);
    if (key == (char *)0x0) {
      return;
    }
    if (key == "") {
      UVar4 = ucol_looksLikeCollationBinary_63(ds,puVar1 + 2,iVar8);
      uVar6 = (uint)UVar4;
    }
    else {
      iVar9 = (*ds->compareInvChars)(ds,key,-1,L"%%CollationBin",0xe);
      uVar6 = (uint)(iVar9 == 0);
    }
    if (uVar6 == 0) {
      return;
    }
    ucol_swap_63(ds,puVar1 + 2,iVar8,(void *)((long)pvVar15 + 4),pErrorCode);
    return;
  case 2:
    uVar5 = (*ds->readUInt16)(*puVar1);
    uVar6 = (uint)uVar5;
    pRVar13 = (Resource *)(puVar1 + 1);
    local_48 = (Resource *)((long)pvVar15 + 2);
    (*ds->swapArray16)(ds,puVar1,2,pvVar15,pErrorCode);
    uVar10 = uVar5 + 2 >> 1;
    local_68 = (Resource *)0x0;
    local_50 = (Resource *)0x0;
    break;
  case 4:
    uVar6 = udata_readInt32_63(ds,*(int32_t *)puVar1);
    local_68 = (Resource *)(puVar1 + 2);
    local_50 = (Resource *)((long)pvVar15 + 4);
    (*ds->swapArray32)(ds,puVar1,4,pvVar15,pErrorCode);
    uVar10 = uVar6 + 1;
    pRVar13 = (Resource *)0x0;
    local_48 = (Resource *)0x0;
    break;
  default:
    goto switchD_002cd023_caseD_5;
  case 8:
    uVar6 = udata_readInt32_63(ds,*(int32_t *)puVar1);
    (*ds->swapArray32)(ds,puVar1,4,pvVar15,pErrorCode);
    if (0 < (int)uVar6) {
      uVar12 = 0;
      do {
        uVar7 = (*ds->readUInt32)(*(uint32_t *)((long)(puVar1 + 2) + uVar12 * 4));
        ures_swapResource(ds,inBundle,outBundle,uVar7,(char *)0x0,pTempTable,pErrorCode);
        if (U_ZERO_ERROR < *pErrorCode) {
          pcVar14 = "ures_swapResource(array res=%08x)[%d].recurse(%08x) failed\n";
          goto LAB_002cd430;
        }
        uVar12 = uVar12 + 1;
      } while (uVar6 != uVar12);
    }
    UNRECOVERED_JUMPTABLE = ds->swapArray32;
    iVar11 = uVar6 << 2;
    local_50 = (Resource *)((long)pvVar15 + 4);
    local_68 = (Resource *)(puVar1 + 2);
    goto LAB_002cd13c;
  case 0xe:
    iVar8 = udata_readInt32_63(ds,*(int32_t *)puVar1);
    (*ds->swapArray32)(ds,puVar1,iVar8 * 4 + 4,pvVar15,pErrorCode);
    return;
  }
  if (uVar6 == 0) {
    return;
  }
  pRVar2 = inBundle + (int)(uVar10 + uVar17);
  if (0 < (int)uVar6) {
    uVar12 = 0;
    do {
      if (pRVar13 == (Resource *)0x0) {
        uVar7 = udata_readInt32_63(ds,local_68[uVar12]);
        bVar19 = -1 < (int)uVar7;
        uVar18 = (ulong)uVar7;
      }
      else {
        uVar5 = (*ds->readUInt16)(*(uint16_t *)((long)pRVar13 + uVar12 * 2));
        uVar18 = (ulong)uVar5;
        bVar19 = (int)(uint)uVar5 < pTempTable->localKeyLimit;
      }
      if (bVar19) {
        pcVar14 = (char *)(uVar18 + (long)outBundle);
      }
      else {
        pcVar14 = "";
      }
      uVar7 = (*ds->readUInt32)(pRVar2[uVar12]);
      ures_swapResource(ds,inBundle,outBundle,uVar7,pcVar14,pTempTable,pErrorCode);
      if (U_ZERO_ERROR < *pErrorCode) {
        pcVar14 = "ures_swapResource(table res=%08x)[%d].recurse(%08x) failed\n";
LAB_002cd430:
        udata_printError_63(ds,pcVar14,(ulong)res,uVar12 & 0xffffffff,(ulong)uVar7);
        return;
      }
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  __dest = outBundle + (int)(uVar10 + uVar17);
  if ((1 < pTempTable->majorFormatVersion) || (ds->inCharset == ds->outCharset)) {
    if (pRVar13 == (Resource *)0x0) {
      UNRECOVERED_JUMPTABLE = ds->swapArray32;
      iVar11 = uVar6 << 3;
    }
    else {
      (*ds->swapArray16)(ds,pRVar13,uVar6 * 2,local_48,pErrorCode);
      UNRECOVERED_JUMPTABLE = ds->swapArray32;
      iVar11 = uVar6 << 2;
      local_50 = __dest;
      local_68 = pRVar2;
    }
LAB_002cd13c:
    (*UNRECOVERED_JUMPTABLE)(ds,local_68,iVar11,local_50,pErrorCode);
    return;
  }
  if (pRVar13 == (Resource *)0x0) {
    if (0 < (int)uVar6) {
      uVar12 = 0;
      do {
        iVar8 = udata_readInt32_63(ds,local_68[uVar12]);
        pRVar3 = pTempTable->rows;
        pRVar3[uVar12].keyIndex = iVar8;
        pRVar3[uVar12].sortIndex = (int32_t)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar6 != uVar12);
    }
  }
  else if (0 < (int)uVar6) {
    uVar12 = 0;
    do {
      uVar5 = (*ds->readUInt16)(*(uint16_t *)((long)pRVar13 + uVar12 * 2));
      pRVar3 = pTempTable->rows;
      pRVar3[uVar12].keyIndex = (uint)uVar5;
      pRVar3[uVar12].sortIndex = (int32_t)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  uprv_sortArray_63(pTempTable->rows,uVar6,8,ures_compareRows,pTempTable->keyChars,'\0',pErrorCode);
  if (U_ZERO_ERROR < *pErrorCode) {
    udata_printError_63(ds,"ures_swapResource(table res=%08x).uprv_sortArray(%d items) failed\n",
                        (ulong)res,(ulong)uVar6);
    return;
  }
  if (pRVar13 == (Resource *)0x0) {
    __src = local_50;
    if (local_68 == local_50) {
      __src = (Resource *)pTempTable->resort;
    }
    if (0 < (int)uVar6) {
      lVar16 = 0;
      do {
        (*ds->swapArray32)(ds,local_68 + *(int *)((long)&pTempTable->rows->sortIndex + lVar16 * 2),4
                           ,(void *)((long)__src + lVar16),pErrorCode);
        lVar16 = lVar16 + 4;
      } while ((ulong)uVar6 << 2 != lVar16);
    }
    if (local_50 == __src) goto LAB_002cd660;
    iVar11 = uVar6 * 4;
    local_48 = local_50;
  }
  else {
    __src = local_48;
    if (pRVar13 == local_48) {
      __src = (Resource *)pTempTable->resort;
    }
    if (0 < (int)uVar6) {
      lVar16 = 0;
      do {
        (*ds->swapArray16)(ds,(uint16_t *)
                              ((long)pRVar13 + (long)(&pTempTable->rows->sortIndex)[lVar16] * 2),2,
                           (void *)((long)__src + lVar16),pErrorCode);
        lVar16 = lVar16 + 2;
      } while ((ulong)uVar6 * 2 != lVar16);
    }
    if (local_48 == __src) goto LAB_002cd660;
    iVar11 = uVar6 * 2;
  }
  memcpy(local_48,__src,(long)iVar11);
LAB_002cd660:
  pRVar13 = __dest;
  if (inBundle == outBundle) {
    pRVar13 = (Resource *)pTempTable->resort;
  }
  if (0 < (int)uVar6) {
    lVar16 = 0;
    do {
      (*ds->swapArray32)(ds,pRVar2 + *(int *)((long)&pTempTable->rows->sortIndex + lVar16 * 2),4,
                         (void *)(lVar16 + (long)pRVar13),pErrorCode);
      lVar16 = lVar16 + 4;
    } while ((ulong)uVar6 << 2 != lVar16);
  }
  if (__dest == pRVar13) {
    return;
  }
  memcpy(__dest,pRVar13,(long)(int)(uVar6 << 2));
  return;
}

Assistant:

static void
ures_swapResource(const UDataSwapper *ds,
                  const Resource *inBundle, Resource *outBundle,
                  Resource res, /* caller swaps res itself */
                  const char *key,
                  TempTable *pTempTable,
                  UErrorCode *pErrorCode) {
    const Resource *p;
    Resource *q;
    int32_t offset, count;

    switch(RES_GET_TYPE(res)) {
    case URES_TABLE16:
    case URES_STRING_V2:
    case URES_INT:
    case URES_ARRAY16:
        /* integer, or points to 16-bit units, nothing to do here */
        return;
    default:
        break;
    }

    /* all other types use an offset to point to their data */
    offset=(int32_t)RES_GET_OFFSET(res);
    if(offset==0) {
        /* special offset indicating an empty item */
        return;
    }
    if(pTempTable->resFlags[offset>>5]&((uint32_t)1<<(offset&0x1f))) {
        /* we already swapped this resource item */
        return;
    } else {
        /* mark it as swapped now */
        pTempTable->resFlags[offset>>5]|=((uint32_t)1<<(offset&0x1f));
    }

    p=inBundle+offset;
    q=outBundle+offset;

    switch(RES_GET_TYPE(res)) {
    case URES_ALIAS:
        /* physically same value layout as string, fall through */
        U_FALLTHROUGH;
    case URES_STRING:
        count=udata_readInt32(ds, (int32_t)*p);
        /* swap length */
        ds->swapArray32(ds, p, 4, q, pErrorCode);
        /* swap each UChar (the terminating NUL would not change) */
        ds->swapArray16(ds, p+1, 2*count, q+1, pErrorCode);
        break;
    case URES_BINARY:
        count=udata_readInt32(ds, (int32_t)*p);
        /* swap length */
        ds->swapArray32(ds, p, 4, q, pErrorCode);
        /* no need to swap or copy bytes - ures_swap() copied them all */

        /* swap known formats */
#if !UCONFIG_NO_COLLATION
        if( key!=NULL &&  /* the binary is in a table */
            (key!=gUnknownKey ?
                /* its table key string is "%%CollationBin" */
                0==ds->compareInvChars(ds, key, -1,
                                       gCollationBinKey, UPRV_LENGTHOF(gCollationBinKey)-1) :
                /* its table key string is unknown but it looks like a collation binary */
                ucol_looksLikeCollationBinary(ds, p+1, count))
        ) {
            ucol_swap(ds, p+1, count, q+1, pErrorCode);
        }
#endif
        break;
    case URES_TABLE:
    case URES_TABLE32:
        {
            const uint16_t *pKey16;
            uint16_t *qKey16;

            const int32_t *pKey32;
            int32_t *qKey32;

            Resource item;
            int32_t i, oldIndex;

            if(RES_GET_TYPE(res)==URES_TABLE) {
                /* get table item count */
                pKey16=(const uint16_t *)p;
                qKey16=(uint16_t *)q;
                count=ds->readUInt16(*pKey16);

                pKey32=qKey32=NULL;

                /* swap count */
                ds->swapArray16(ds, pKey16++, 2, qKey16++, pErrorCode);

                offset+=((1+count)+1)/2;
            } else {
                /* get table item count */
                pKey32=(const int32_t *)p;
                qKey32=(int32_t *)q;
                count=udata_readInt32(ds, *pKey32);

                pKey16=qKey16=NULL;

                /* swap count */
                ds->swapArray32(ds, pKey32++, 4, qKey32++, pErrorCode);

                offset+=1+count;
            }

            if(count==0) {
                break;
            }

            p=inBundle+offset; /* pointer to table resources */
            q=outBundle+offset;

            /* recurse */
            for(i=0; i<count; ++i) {
                const char *itemKey=gUnknownKey;
                if(pKey16!=NULL) {
                    int32_t keyOffset=ds->readUInt16(pKey16[i]);
                    if(keyOffset<pTempTable->localKeyLimit) {
                        itemKey=(const char *)outBundle+keyOffset;
                    }
                } else {
                    int32_t keyOffset=udata_readInt32(ds, pKey32[i]);
                    if(keyOffset>=0) {
                        itemKey=(const char *)outBundle+keyOffset;
                    }
                }
                item=ds->readUInt32(p[i]);
                ures_swapResource(ds, inBundle, outBundle, item, itemKey, pTempTable, pErrorCode);
                if(U_FAILURE(*pErrorCode)) {
                    udata_printError(ds, "ures_swapResource(table res=%08x)[%d].recurse(%08x) failed\n",
                                     res, i, item);
                    return;
                }
            }

            if(pTempTable->majorFormatVersion>1 || ds->inCharset==ds->outCharset) {
                /* no need to sort, just swap the offset/value arrays */
                if(pKey16!=NULL) {
                    ds->swapArray16(ds, pKey16, count*2, qKey16, pErrorCode);
                    ds->swapArray32(ds, p, count*4, q, pErrorCode);
                } else {
                    /* swap key offsets and items as one array */
                    ds->swapArray32(ds, pKey32, count*2*4, qKey32, pErrorCode);
                }
                break;
            }

            /*
             * We need to sort tables by outCharset key strings because they
             * sort differently for different charset families.
             * ures_swap() already set pTempTable->keyChars appropriately.
             * First we set up a temporary table with the key indexes and
             * sorting indexes and sort that.
             * Then we permutate and copy/swap the actual values.
             */
            if(pKey16!=NULL) {
                for(i=0; i<count; ++i) {
                    pTempTable->rows[i].keyIndex=ds->readUInt16(pKey16[i]);
                    pTempTable->rows[i].sortIndex=i;
                }
            } else {
                for(i=0; i<count; ++i) {
                    pTempTable->rows[i].keyIndex=udata_readInt32(ds, pKey32[i]);
                    pTempTable->rows[i].sortIndex=i;
                }
            }
            uprv_sortArray(pTempTable->rows, count, sizeof(Row),
                           ures_compareRows, pTempTable->keyChars,
                           FALSE, pErrorCode);
            if(U_FAILURE(*pErrorCode)) {
                udata_printError(ds, "ures_swapResource(table res=%08x).uprv_sortArray(%d items) failed\n",
                                 res, count);
                return;
            }

            /*
             * copy/swap/permutate items
             *
             * If we swap in-place, then the permutation must use another
             * temporary array (pTempTable->resort)
             * before the results are copied to the outBundle.
             */
            /* keys */
            if(pKey16!=NULL) {
                uint16_t *rKey16;

                if(pKey16!=qKey16) {
                    rKey16=qKey16;
                } else {
                    rKey16=(uint16_t *)pTempTable->resort;
                }
                for(i=0; i<count; ++i) {
                    oldIndex=pTempTable->rows[i].sortIndex;
                    ds->swapArray16(ds, pKey16+oldIndex, 2, rKey16+i, pErrorCode);
                }
                if(qKey16!=rKey16) {
                    uprv_memcpy(qKey16, rKey16, 2*count);
                }
            } else {
                int32_t *rKey32;

                if(pKey32!=qKey32) {
                    rKey32=qKey32;
                } else {
                    rKey32=pTempTable->resort;
                }
                for(i=0; i<count; ++i) {
                    oldIndex=pTempTable->rows[i].sortIndex;
                    ds->swapArray32(ds, pKey32+oldIndex, 4, rKey32+i, pErrorCode);
                }
                if(qKey32!=rKey32) {
                    uprv_memcpy(qKey32, rKey32, 4*count);
                }
            }

            /* resources */
            {
                Resource *r;


                if(p!=q) {
                    r=q;
                } else {
                    r=(Resource *)pTempTable->resort;
                }
                for(i=0; i<count; ++i) {
                    oldIndex=pTempTable->rows[i].sortIndex;
                    ds->swapArray32(ds, p+oldIndex, 4, r+i, pErrorCode);
                }
                if(q!=r) {
                    uprv_memcpy(q, r, 4*count);
                }
            }
        }
        break;
    case URES_ARRAY:
        {
            Resource item;
            int32_t i;

            count=udata_readInt32(ds, (int32_t)*p);
            /* swap length */
            ds->swapArray32(ds, p++, 4, q++, pErrorCode);

            /* recurse */
            for(i=0; i<count; ++i) {
                item=ds->readUInt32(p[i]);
                ures_swapResource(ds, inBundle, outBundle, item, NULL, pTempTable, pErrorCode);
                if(U_FAILURE(*pErrorCode)) {
                    udata_printError(ds, "ures_swapResource(array res=%08x)[%d].recurse(%08x) failed\n",
                                     res, i, item);
                    return;
                }
            }

            /* swap items */
            ds->swapArray32(ds, p, 4*count, q, pErrorCode);
        }
        break;
    case URES_INT_VECTOR:
        count=udata_readInt32(ds, (int32_t)*p);
        /* swap length and each integer */
        ds->swapArray32(ds, p, 4*(1+count), q, pErrorCode);
        break;
    default:
        /* also catches RES_BOGUS */
        *pErrorCode=U_UNSUPPORTED_ERROR;
        break;
    }
}